

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O2

void checktab(lua_State *L,int arg,int what)

{
  int iVar1;
  uint n;
  
  iVar1 = lua_type(L,arg);
  if (iVar1 == 5) {
    return;
  }
  iVar1 = lua_getmetatable(L,arg);
  if (iVar1 != 0) {
    if ((what & 1U) == 0) {
      n = 1;
    }
    else {
      n = 2;
      iVar1 = checkfield(L,"__index",2);
      if (iVar1 == 0) goto LAB_0011c043;
    }
    if ((what & 2U) != 0) {
      n = n + 1;
      iVar1 = checkfield(L,"__newindex",n);
      if (iVar1 == 0) goto LAB_0011c043;
    }
    if ((what & 4U) != 0) {
      n = n + 1;
      iVar1 = checkfield(L,"__len",n);
      if (iVar1 == 0) goto LAB_0011c043;
    }
    lua_settop(L,~n);
    return;
  }
LAB_0011c043:
  luaL_checktype(L,arg,5);
  return;
}

Assistant:

static void checktab (lua_State *L, int arg, int what) {
  if (lua_type(L, arg) != LUA_TTABLE) {  /* is it not a table? */
    int n = 1;  /* number of elements to pop */
    if (lua_getmetatable(L, arg) &&  /* must have metatable */
        (!(what & TAB_R) || checkfield(L, "__index", ++n)) &&
        (!(what & TAB_W) || checkfield(L, "__newindex", ++n)) &&
        (!(what & TAB_L) || checkfield(L, "__len", ++n))) {
      lua_pop(L, n);  /* pop metatable and tested metamethods */
    }
    else
      luaL_checktype(L, arg, LUA_TTABLE);  /* force an error */
  }
}